

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

SpatialMatrix * RigidBodyDynamics::Math::Xtrans_mat(Vector3d *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  SpatialMatrix *in_RDI;
  
  dVar1 = (r->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[0];
  dVar2 = (r->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1];
  dVar3 = (r->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[2];
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
  *(undefined4 *)
   ((in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 6) = 0;
  *(undefined4 *)
   ((long)(in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x34
   ) = 0;
  *(undefined4 *)
   ((in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 7) = 0;
  *(undefined4 *)
   ((long)(in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x3c
   ) = 0x3ff00000;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe] = 1.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x13] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x14] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x19] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1a] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1f] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x20] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = dVar3;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf] = -dVar2;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = -dVar3;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x10] = dVar1;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x15] = 1.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x16] = 0.0;
  *(undefined4 *)
   ((in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x1b) = 0;
  *(undefined4 *)
   ((long)(in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0xdc
   ) = 0;
  *(undefined4 *)
   ((in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x1c) = 0;
  *(undefined4 *)
   ((long)(in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0xe4
   ) = 0x3ff00000;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x21] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x22] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = dVar2;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = -dVar1;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x11] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x12] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x17] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x18] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1d] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1e] = 0.0;
  (in_RDI->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x23] = 1.0;
  return in_RDI;
}

Assistant:

RBDL_DLLAPI SpatialMatrix Xtrans_mat (const Vector3d &r) {
  return SpatialMatrix (
      1.,    0.,    0.,  0.,  0.,  0.,
      0.,    1.,    0.,  0.,  0.,  0.,
      0.,    0.,    1.,  0.,  0.,  0.,
      0.,  r[2], -r[1],  1.,  0.,  0.,
      -r[2],    0.,  r[0],  0.,  1.,  0.,
      r[1], -r[0],    0.,  0.,  0.,  1.
      );
}